

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool ON_IsOrthogonalFrame(ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_3dVector local_108;
  ON_3dVector local_f0;
  ON_3dVector local_d8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  double local_78;
  ON_3dVector V;
  double t;
  double zx;
  double yz;
  double xy;
  double lz;
  double ly;
  double lx;
  ON_3dVector *Z_local;
  ON_3dVector *Y_local;
  ON_3dVector *X_local;
  
  bVar1 = ON_3dVector::IsValid(X);
  if (((bVar1) && (bVar1 = ON_3dVector::IsValid(Y), bVar1)) &&
     (bVar1 = ON_3dVector::IsValid(Z), bVar1)) {
    dVar2 = ON_3dVector::Length(X);
    dVar3 = ON_3dVector::Length(Y);
    dVar4 = ON_3dVector::Length(Z);
    if (1.490116119385e-08 < dVar2) {
      if (1.490116119385e-08 < dVar3) {
        if (1.490116119385e-08 < dVar4) {
          dVar2 = 1.0 / dVar2;
          dVar3 = 1.0 / dVar3;
          dVar4 = 1.0 / dVar4;
          dVar5 = (X->z * Y->z + X->x * Y->x + X->y * Y->y) * dVar2 * dVar3;
          dVar6 = (Y->z * Z->z + Y->x * Z->x + Y->y * Z->y) * dVar3 * dVar4;
          dVar7 = (Z->z * X->z + Z->x * X->x + Z->y * X->y) * dVar4 * dVar2;
          if (((1.490116119385e-08 < ABS(dVar5)) || (1.490116119385e-08 < ABS(dVar6))) ||
             (1.490116119385e-08 < ABS(dVar7))) {
            V.z = 1.52587890625e-05;
            if (((1.52587890625e-05 <= ABS(dVar5)) || (1.52587890625e-05 <= ABS(dVar6))) ||
               (1.52587890625e-05 <= ABS(dVar7))) {
              return false;
            }
            ON_CrossProduct(&local_a8,X,Y);
            operator*(&local_90,dVar2 * dVar3,&local_a8);
            local_78 = local_90.x;
            V.x = local_90.y;
            V.y = local_90.z;
            V.z = ABS((local_90.z * Z->z + local_90.x * Z->x + local_90.y * Z->y) * dVar4);
            if (1.490116119385e-08 < ABS(V.z - 1.0)) {
              return false;
            }
            ON_CrossProduct(&local_d8,Y,Z);
            operator*(&local_c0,dVar3 * dVar4,&local_d8);
            local_78 = local_c0.x;
            V.x = local_c0.y;
            V.y = local_c0.z;
            V.z = ABS((local_c0.z * X->z + local_c0.x * X->x + local_c0.y * X->y) * dVar2);
            if (1.490116119385e-08 < ABS(V.z - 1.0)) {
              return false;
            }
            ON_CrossProduct(&local_108,Z,X);
            operator*(&local_f0,dVar4 * dVar2,&local_108);
            if (1.490116119385e-08 <
                ABS(ABS((local_f0.z * Y->z + local_f0.x * Y->x + local_f0.y * Y->y) * dVar3) - 1.0))
            {
              return false;
            }
          }
          X_local._7_1_ = true;
        }
        else {
          X_local._7_1_ = false;
        }
      }
      else {
        X_local._7_1_ = false;
      }
    }
    else {
      X_local._7_1_ = false;
    }
  }
  else {
    X_local._7_1_ = false;
  }
  return X_local._7_1_;
}

Assistant:

bool ON_IsOrthogonalFrame( const ON_3dVector& X,  const ON_3dVector& Y,  const ON_3dVector& Z )
{
  // returns true if X, Y, Z is an orthogonal frame
  if (! X.IsValid() || !Y.IsValid() || !Z.IsValid() )
    return false;

  double lx = X.Length();
  double ly = Y.Length();
  double lz = Z.Length();
  if ( lx <=  ON_SQRT_EPSILON )
    return false;
  if ( ly <=  ON_SQRT_EPSILON )
    return false;
  if ( lz <=  ON_SQRT_EPSILON )
    return false;
  lx = 1.0/lx;
  ly = 1.0/ly;
  lz = 1.0/lz;
  double xy = (X.x*Y.x + X.y*Y.y + X.z*Y.z)*lx*ly;
  double yz = (Y.x*Z.x + Y.y*Z.y + Y.z*Z.z)*ly*lz;
  double zx = (Z.x*X.x + Z.y*X.y + Z.z*X.z)*lz*lx;
  if (    fabs(xy) > ON_SQRT_EPSILON 
       || fabs(yz) > ON_SQRT_EPSILON
       || fabs(zx) > ON_SQRT_EPSILON
     )
  {
    double t = 0.0000152587890625;
    if ( fabs(xy) >= t || fabs(yz)  >= t || fabs(zx) >= t )
      return false;

    // do a more careful (and time consuming check)
    // This fixes RR 22219 and 22276
    ON_3dVector V;
    V = (lx*ly)*ON_CrossProduct(X,Y);
    t = fabs((V.x*Z.x + V.y*Z.y + V.z*Z.z)*lz);
    if ( fabs(t-1.0) > ON_SQRT_EPSILON )
      return false;

    V = (ly*lz)*ON_CrossProduct(Y,Z);
    t = fabs((V.x*X.x + V.y*X.y + V.z*X.z)*lx);
    if ( fabs(t-1.0) > ON_SQRT_EPSILON )
      return false;

    V = (lz*lx)*ON_CrossProduct(Z,X);
    t = fabs((V.x*Y.x + V.y*Y.y + V.z*Y.z)*ly);
    if ( fabs(t-1.0) > ON_SQRT_EPSILON )
      return false;
  }
  return true;
}